

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_eori_32_d(void)

{
  uint uVar1;
  uint res;
  
  uVar1 = m68ki_read_imm_32();
  m68ki_cpu.not_z_flag = uVar1 ^ m68ki_cpu.dar[m68ki_cpu.ir & 7];
  m68ki_cpu.dar[m68ki_cpu.ir & 7] = m68ki_cpu.not_z_flag;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_eori_32_d(void)
{
	uint res = DY ^= OPER_I_32();

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}